

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

bool __thiscall
google::
dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>
::maybe_shrink(dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
               *this)

{
  byte bVar1;
  byte bVar2;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
  *in_RDI;
  float fVar3;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
  tmp;
  size_type sz;
  float shrink_factor;
  size_type shrink_threshold;
  size_type num_remain;
  bool retval;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
  *this_00;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 uVar4;
  size_type in_stack_ffffffffffffffa7;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
  *in_stack_ffffffffffffffa8;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
  *in_stack_ffffffffffffffb0;
  byte local_11;
  bool local_9;
  
  local_9 = false;
  bVar1 = in_RDI->num_elements - in_RDI->num_deleted;
  bVar2 = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>::
          shrink_threshold((sh_hashtable_settings<int,_Hasher,_unsigned_char,_4> *)in_RDI);
  if (((bVar2 != 0) && (bVar1 < bVar2)) && (bVar2 = bucket_count(in_RDI), 0x20 < bVar2)) {
    fVar3 = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>::shrink_factor
                      ((sh_hashtable_settings<int,_Hasher,_unsigned_char,_4> *)in_RDI);
    local_11 = bucket_count(in_RDI);
    do {
      local_11 = local_11 / 2;
      uVar4 = false;
      if (0x20 < local_11) {
        uVar4 = (float)bVar1 < (float)local_11 * fVar3;
      }
    } while ((bool)uVar4 != false);
    this_00 = (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
               *)&stack0xffffffffffffff98;
    dense_hashtable(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7);
    swap(in_RDI,(dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                 *)CONCAT17(uVar4,in_stack_ffffffffffffff78));
    local_9 = true;
    ~dense_hashtable(this_00);
  }
  sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>::set_consider_shrink
            ((sh_hashtable_settings<int,_Hasher,_unsigned_char,_4> *)in_RDI,false);
  return local_9;
}

Assistant:

bool maybe_shrink() {
    assert(num_elements >= num_deleted);
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // is a power of two
    assert(bucket_count() >= HT_MIN_BUCKETS);
    bool retval = false;

    // If you construct a hashtable with < HT_DEFAULT_STARTING_BUCKETS,
    // we'll never shrink until you get relatively big, and we'll never
    // shrink below HT_DEFAULT_STARTING_BUCKETS.  Otherwise, something
    // like "dense_hash_set<int> x; x.insert(4); x.erase(4);" will
    // shrink us down to HT_MIN_BUCKETS buckets, which is too small.
    const size_type num_remain = num_elements - num_deleted;
    const size_type shrink_threshold = settings.shrink_threshold();
    if (shrink_threshold > 0 && num_remain < shrink_threshold &&
        bucket_count() > HT_DEFAULT_STARTING_BUCKETS) {
      const float shrink_factor = settings.shrink_factor();
      size_type sz = bucket_count() / 2;  // find how much we should shrink
      while (sz > HT_DEFAULT_STARTING_BUCKETS &&
             num_remain < sz * shrink_factor) {
        sz /= 2;  // stay a power of 2
      }
      dense_hashtable tmp(std::move(*this), sz);  // Do the actual resizing
      swap(tmp);                       // now we are tmp
      retval = true;
    }
    settings.set_consider_shrink(false);  // because we just considered it
    return retval;
  }